

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

Status __thiscall
google::protobuf::json_internal::anon_unknown_5::
ParseMessage<google::protobuf::json_internal::ParseProto3Type>
          (anon_unknown_5 *this,JsonLexer *lex,
          Desc<google::protobuf::json_internal::ParseProto3Type> *desc,
          Msg<google::protobuf::json_internal::ParseProto3Type> *msg,bool any_reparse)

{
  anon_class_40_5_b6e148d6 f;
  Desc<google::protobuf::json_internal::ParseProto3Type> *field;
  bool bVar1;
  ParseOptions *pPVar2;
  Msg<google::protobuf::json_internal::ParseProto3Type> *pMVar3;
  string_view sVar4;
  json_internal *pjStack_40;
  bool is_upcoming_object;
  MessageType local_30;
  byte local_29;
  MessageType type;
  bool any_reparse_local;
  Msg<google::protobuf::json_internal::ParseProto3Type> *msg_local;
  Desc<google::protobuf::json_internal::ParseProto3Type> *desc_local;
  JsonLexer *lex_local;
  
  local_29 = any_reparse;
  _type = msg;
  msg_local = (Msg<google::protobuf::json_internal::ParseProto3Type> *)desc;
  desc_local = (Desc<google::protobuf::json_internal::ParseProto3Type> *)lex;
  lex_local = (JsonLexer *)this;
  sVar4 = Proto3Type::TypeName(desc);
  pjStack_40 = (json_internal *)sVar4._M_len;
  sVar4._M_len = (size_t)sVar4._M_str;
  local_30 = ClassifyMessage(pjStack_40,sVar4);
  if ((local_29 & 1) == 0) {
    if (local_30 == kAny) {
      ParseAny<google::protobuf::json_internal::ParseProto3Type>
                ((JsonLexer *)this,desc_local,msg_local);
      return (Status)(uintptr_t)this;
    }
    if (local_30 == kStruct) {
      ParseStructValue<google::protobuf::json_internal::ParseProto3Type>
                (this,(JsonLexer *)desc_local,
                 (Desc<google::protobuf::json_internal::ParseProto3Type> *)msg_local,_type);
      return (Status)(uintptr_t)this;
    }
    if (local_30 == kValue) {
      ParseValue<google::protobuf::json_internal::ParseProto3Type>
                (this,(JsonLexer *)desc_local,
                 (Desc<google::protobuf::json_internal::ParseProto3Type> *)msg_local,_type);
      return (Status)(uintptr_t)this;
    }
    bVar1 = JsonLexer::Peek((JsonLexer *)desc_local,kObj);
    if ((!bVar1) ||
       (pPVar2 = JsonLexer::options((JsonLexer *)desc_local),
       (pPVar2->allow_legacy_syntax & 1U) == 0)) {
      field = desc_local;
      pMVar3 = msg_local;
      switch(local_30) {
      case kWrapper:
        JsonLocation::SourceLocation::current();
        pMVar3 = (Msg<google::protobuf::json_internal::ParseProto3Type> *)
                 Proto3Type::MustHaveField(pMVar3,1);
        ParseSingular<google::protobuf::json_internal::ParseProto3Type>
                  ((JsonLexer *)this,(Field<google::protobuf::json_internal::ParseProto3Type>)field,
                   pMVar3);
        return (Status)(uintptr_t)this;
      default:
        break;
      case kList:
        ParseListValue<google::protobuf::json_internal::ParseProto3Type>
                  (this,(JsonLexer *)desc_local,
                   (Desc<google::protobuf::json_internal::ParseProto3Type> *)msg_local,_type);
        return (Status)(uintptr_t)this;
      case kTimestamp:
        ParseTimestamp<google::protobuf::json_internal::ParseProto3Type>
                  ((JsonLexer *)this,desc_local,msg_local);
        return (Status)(uintptr_t)this;
      case kDuration:
        ParseDuration<google::protobuf::json_internal::ParseProto3Type>
                  (this,(JsonLexer *)desc_local,
                   (Desc<google::protobuf::json_internal::ParseProto3Type> *)msg_local,_type);
        return (Status)(uintptr_t)this;
      case kFieldMask:
        ParseFieldMask<google::protobuf::json_internal::ParseProto3Type>
                  ((JsonLexer *)this,desc_local,msg_local);
        return (Status)(uintptr_t)this;
      }
    }
  }
  f.lex = (JsonLexer *)desc_local;
  f.any_reparse = (bool *)&local_29;
  f.type = &local_30;
  f.desc = (Desc<google::protobuf::json_internal::ParseProto3Type> *)msg_local;
  f.msg = _type;
  JsonLexer::
  VisitObject<google::protobuf::json_internal::(anonymous_namespace)::ParseMessage<google::protobuf::json_internal::ParseProto3Type>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto3Type::Desc_const&,google::protobuf::json_internal::ParseProto3Type::Msg&,bool)::_lambda(google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>&)_1_>
            ((JsonLexer *)this,f);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ParseMessage(JsonLexer& lex, const Desc<Traits>& desc,
                          Msg<Traits>& msg, bool any_reparse) {
  MessageType type = ClassifyMessage(Traits::TypeName(desc));
  if (!any_reparse) {
    switch (type) {
      case MessageType::kAny:
        return ParseAny<Traits>(lex, desc, msg);
      case MessageType::kValue:
        return ParseValue<Traits>(lex, desc, msg);
      case MessageType::kStruct:
        return ParseStructValue<Traits>(lex, desc, msg);
      default:
        break;
    }
    // For some types, the ESF parser permits parsing the "non-special" version.
    // It is not clear if this counts as out-of-spec, but we're treating it as
    // such.
    bool is_upcoming_object = lex.Peek(JsonLexer::kObj);
    if (!(is_upcoming_object && lex.options().allow_legacy_syntax)) {
      switch (type) {
        case MessageType::kList:
          return ParseListValue<Traits>(lex, desc, msg);
        case MessageType::kWrapper: {
          return ParseSingular<Traits>(lex, Traits::MustHaveField(desc, 1),
                                       msg);
        }
        case MessageType::kTimestamp:
          return ParseTimestamp<Traits>(lex, desc, msg);
        case MessageType::kDuration:
          return ParseDuration<Traits>(lex, desc, msg);
        case MessageType::kFieldMask:
          return ParseFieldMask<Traits>(lex, desc, msg);
        default:
          break;
      }
    }
  }

  return lex.VisitObject(
      [&](LocationWith<MaybeOwnedString>& name) -> absl::Status {
        // If this is a well-known type, we expect its contents to be inside
        // of a JSON field named "value".
        if (any_reparse) {
          if (name.value == "@type") {
            RETURN_IF_ERROR(lex.SkipValue());
            return absl::OkStatus();
          }
          if (type != MessageType::kNotWellKnown) {
            if (name.value != "value") {
              return lex.Invalid(
                  "fields in a well-known-typed Any must be @type or value");
            }
            // Parse the upcoming value as the message itself. This is *not*
            // an Any reparse because we do not expect to see @type in the
            // upcoming value.
            return ParseMessage<Traits>(lex, desc, msg,
                                        /*any_reparse=*/false);
          }
        }

        return ParseField<Traits>(lex, desc, name.value.ToString(), msg);
      });
}